

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O2

optional<uuids::uuid> *
uuids::uuid::from_string<char[3]>(optional<uuids::uuid> *__return_storage_ptr__,char (*in_str) [3])

{
  byte bVar1;
  bool bVar2;
  uchar uVar3;
  byte bVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  array<unsigned_char,_16UL> data;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar11 = detail::to_string_view<char>(*in_str);
  pcVar6 = bVar11._M_str;
  sVar5 = bVar11._M_len;
  local_48 = 0;
  uStack_40 = 0;
  if ((sVar5 != 0) && ((*pcVar6 != '{' || (pcVar6[sVar5 - 1] == '}')))) {
    uVar8 = (ulong)(*pcVar6 == '{');
    uVar10 = sVar5 - uVar8;
    bVar7 = true;
    uVar9 = 0;
    for (; uVar8 < uVar10; uVar8 = uVar8 + 1) {
      if (pcVar6[uVar8] != '-') {
        if (0xf < uVar9) goto LAB_0015e624;
        bVar2 = detail::is_hex<char>(pcVar6[uVar8]);
        if (!bVar2) goto LAB_0015e624;
        if (bVar7) {
          uVar3 = detail::hex2char<char>(pcVar6[uVar8]);
          *(uchar *)((long)&local_48 + uVar9) = uVar3 << 4;
          bVar7 = false;
        }
        else {
          bVar1 = *(byte *)((long)&local_48 + uVar9);
          bVar4 = detail::hex2char<char>(pcVar6[uVar8]);
          *(byte *)((long)&local_48 + uVar9) = bVar4 | bVar1;
          uVar9 = uVar9 + 1;
          bVar7 = true;
        }
      }
    }
    if (0xf < uVar9) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
        super__Optional_payload_base<uuids::uuid>._M_payload = local_48;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
               super__Optional_payload_base<uuids::uuid>._M_payload + 8) = uStack_40;
      bVar7 = true;
      goto LAB_0015e626;
    }
  }
LAB_0015e624:
  bVar7 = false;
LAB_0015e626:
  (__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
  super__Optional_payload_base<uuids::uuid>._M_engaged = bVar7;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr static std::optional<uuid> from_string(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         std::array<uint8_t, 16> data{ { 0 } };

         if (str.empty()) return {};

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return {};

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return {};
            }

            if (firstDigit)
            {
               data[index] = static_cast<uint8_t>(detail::hex2char(str[i]) << 4);
               firstDigit = false;
            }
            else
            {
               data[index] = static_cast<uint8_t>(data[index] | detail::hex2char(str[i]));
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return {};
         }

         return uuid{ data };
      }